

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O3

void BZ2_bzWrite(int *bzerror,BZFILE *b,void *buf,int len)

{
  int iVar1;
  size_t sVar2;
  size_t __n;
  
  if (bzerror != (int *)0x0) {
    *bzerror = 0;
  }
  if ((b == (BZFILE *)0x0) || (*(undefined4 *)((long)b + 0x13e8) = 0, buf == (void *)0x0 || len < 0)
     ) {
    if (bzerror != (int *)0x0) {
      *bzerror = -2;
    }
    if (b != (BZFILE *)0x0) {
      *(undefined4 *)((long)b + 0x13e8) = 0xfffffffe;
    }
  }
  else if (*(char *)((long)b + 0x1394) == '\0') {
    if (bzerror != (int *)0x0) {
      *bzerror = -1;
    }
    *(undefined4 *)((long)b + 0x13e8) = 0xffffffff;
  }
  else {
    iVar1 = ferror(*b);
    if (iVar1 == 0) {
      if (len != 0) {
        *(int *)((long)b + 0x13a0) = len;
        *(void **)((long)b + 0x1398) = buf;
        do {
          *(undefined4 *)((long)b + 0x13b8) = 5000;
          *(void **)((long)b + 0x13b0) = (void *)((long)b + 8);
          iVar1 = BZ2_bzCompress((bz_stream *)((long)b + 0x1398),0);
          if (iVar1 != 1) {
            if (bzerror != (int *)0x0) {
              *bzerror = iVar1;
            }
            *(int *)((long)b + 0x13e8) = iVar1;
            return;
          }
          if (((ulong)*(uint *)((long)b + 0x13b8) < 5000) &&
             ((__n = 5000 - (ulong)*(uint *)((long)b + 0x13b8),
              sVar2 = fwrite((void *)((long)b + 8),1,__n,*b), (int)__n != (int)sVar2 ||
              (iVar1 = ferror(*b), iVar1 != 0)))) goto LAB_0047421f;
        } while (*(int *)((long)b + 0x13a0) != 0);
      }
      if (bzerror != (int *)0x0) {
        *bzerror = 0;
      }
      *(undefined4 *)((long)b + 0x13e8) = 0;
    }
    else {
LAB_0047421f:
      if (bzerror != (int *)0x0) {
        *bzerror = -6;
      }
      *(undefined4 *)((long)b + 0x13e8) = 0xfffffffa;
    }
  }
  return;
}

Assistant:

void BZ_API(BZ2_bzWrite)
             ( int*    bzerror, 
               BZFILE* b, 
               void*   buf, 
               int     len )
{
   Int32 n, n2, ret;
   bzFile* bzf = (bzFile*)b;

   BZ_SETERR(BZ_OK);
   if (bzf == NULL || buf == NULL || len < 0)
      { BZ_SETERR(BZ_PARAM_ERROR); return; };
   if (!(bzf->writing))
      { BZ_SETERR(BZ_SEQUENCE_ERROR); return; };
   if (ferror(bzf->handle))
      { BZ_SETERR(BZ_IO_ERROR); return; };

   if (len == 0)
      { BZ_SETERR(BZ_OK); return; };

   bzf->strm.avail_in = len;
   bzf->strm.next_in  = buf;

   while (True) {
      bzf->strm.avail_out = BZ_MAX_UNUSED;
      bzf->strm.next_out = bzf->buf;
      ret = BZ2_bzCompress ( &(bzf->strm), BZ_RUN );
      if (ret != BZ_RUN_OK)
         { BZ_SETERR(ret); return; };

      if (bzf->strm.avail_out < BZ_MAX_UNUSED) {
         n = BZ_MAX_UNUSED - bzf->strm.avail_out;
         n2 = fwrite ( (void*)(bzf->buf), sizeof(UChar), 
                       n, bzf->handle );
         if (n != n2 || ferror(bzf->handle))
            { BZ_SETERR(BZ_IO_ERROR); return; };
      }

      if (bzf->strm.avail_in == 0)
         { BZ_SETERR(BZ_OK); return; };
   }
}